

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::EbmlDateElementSize(uint64 type)

{
  int32 iVar1;
  
  iVar1 = GetUIntSize(type);
  return (ulong)(iVar1 + 9);
}

Assistant:

uint64 EbmlDateElementSize(uint64 type) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += kDateElementSize;

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}